

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecpp.c
# Opt level: O1

int main(int argc,char **argv)

{
  fppTag *pfVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  ulong uVar6;
  char *string;
  size_t sVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  fppTag *tagptr;
  fppTag tags [40];
  fppTag *local_2d0;
  char **local_2c8;
  char *local_2c0;
  fppTag local_2b8;
  fppTag local_2a8 [39];
  
  local_2d0 = local_2a8;
  local_2b8.tag = 4;
  local_2b8.data = "/usr/local/share/grcompiler";
  pFVar5 = fopen("cpp.prefs","r");
  if ((pFVar5 == (FILE *)0x0) && (pFVar5 = fopen("$HOME/cpp.prefs","r"), pFVar5 == (FILE *)0x0)) {
    string = (char *)0x0;
LAB_00106ed6:
    pcVar8 = getenv("GDLPP_PREFS");
    if (pcVar8 == (char *)0x0) {
      bVar10 = false;
    }
    else {
      cVar2 = DoString(&local_2d0,pcVar8);
      bVar10 = cVar2 == '\0';
      if ((bVar10) && (bVar10 = true, string != (char *)0x0)) {
        free(string);
      }
    }
    bVar10 = (bool)(bVar10 ^ 1);
  }
  else {
    fseek(pFVar5,0,2);
    uVar6 = ftell(pFVar5);
    fseek(pFVar5,0,0);
    string = (char *)malloc((ulong)((int)uVar6 + 1));
    if (string == (char *)0x0) {
      fclose(pFVar5);
      goto LAB_00106ed6;
    }
    sVar7 = fread(string,1,uVar6 & 0xffffffff,pFVar5);
    string[sVar7] = '\0';
    cVar2 = DoString(&local_2d0,string);
    fclose(pFVar5);
    if (cVar2 != '\0') goto LAB_00106ed6;
    free(string);
    bVar10 = false;
  }
  iVar9 = 0;
  if (!bVar10) {
    return 0;
  }
  iVar3 = SetOptions(argc,argv,&local_2d0);
  pfVar1 = local_2d0;
  if (iVar3 == 0) {
    return 0;
  }
  if (argc - iVar3 < 3) {
    local_2d0->tag = 0xc;
    local_2d0->data = own_input;
    local_2d0 = local_2d0 + 1;
    if (iVar3 < argc) {
      local_2c8 = (char **)(long)iVar3;
      local_2c0 = argv[(long)local_2c8];
      iVar4 = strcmp(local_2c0,"-");
      if (iVar4 == 0) {
        if (display == '\x01') {
          main_cold_4();
        }
      }
      else {
        local_2c8 = argv + (long)local_2c8;
        pFVar5 = freopen(local_2c0,"r",_stdin);
        if (pFVar5 == (FILE *)0x0) {
          main_cold_3();
          return -2;
        }
        pfVar1[1].tag = 0xb;
        pfVar1[1].data = *local_2c8;
        local_2d0 = pfVar1 + 2;
        if (display == '\x01') {
          main_cold_2();
        }
      }
      iVar3 = iVar3 + 1;
    }
    else if (display == '\x01') {
      main_cold_1();
    }
    if (iVar3 < argc) {
      pcVar8 = argv[iVar3];
      iVar3 = strcmp(pcVar8,"-");
      if (iVar3 == 0) {
        if (display == '\x01') {
          main_cold_8();
        }
      }
      else {
        pFVar5 = freopen(pcVar8,"w",_stdout);
        if (pFVar5 == (FILE *)0x0) {
          main_cold_7();
          goto LAB_00106f51;
        }
        if (display == '\x01') {
          main_cold_6();
        }
      }
    }
    else if (display == '\x01') {
      main_cold_5();
    }
    local_2d0->tag = 0xd;
    local_2d0->data = own_output;
    local_2d0[1].tag = 0x10;
    local_2d0[1].data = own_error;
    local_2d0[2].tag = 0;
    local_2d0[2].data = (void *)0x0;
    local_2d0 = local_2d0 + 3;
    fppPreProcess(&local_2b8);
    if (string != (char *)0x0) {
      free(string);
    }
  }
  else {
    puts("Too many file arguments. Usage: cpp [options] [input [output]]");
LAB_00106f51:
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv)
{
  struct fppTag tags[MAX_TAGS];
  int i;
  struct fppTag *tagptr = tags;
  char *dealloc;

  /*
   * Append system-specific directories to the include directory list.
   * The include directories will be searched through in the same order
   * as you add them in the taglist!
   * The directory _must_ end with a proper directory speparator!
   */  

  tagptr->tag=FPPTAG_INCLUDE_DIR;
#if defined (AMIGA)
  tagptr->data = "INCLUDE:";
#elif defined (OS9)
  tagptr->data = "/dd/defs/";
#elif defined (WIN32)
  tagptr->data = "";
#else
  tagptr->data = PKGDATADIR;
#endif
  tagptr++;

  if(GetPrefs(&tagptr, &dealloc))
    return(0);

  if( !(i = SetOptions(argc, argv, &tagptr)))
    return(0);
  
  if (argc - i >2) {
    printf("Too many file arguments. Usage: cpp [options] [input [output]]\n");
    return(-1);
  }

  tagptr->tag=FPPTAG_INPUT;
  tagptr->data=(void *)own_input;
  tagptr++;

  if(i<argc) {
    /*
     * Open input file, "-" means use stdin.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "r", stdin) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open input file \"%s\"", argv[i]);
	return(-2);
      }
      tagptr->tag=FPPTAG_INPUT_NAME;
      tagptr->data=argv[i];
      tagptr++;
      if(display)
	fprintf(stderr, "cpp: input: %s\n", argv[i]);
    } else				/* Else, just get stdin 	*/
      if(display)
	fprintf(stderr, "cpp: input: [stdin]\n");
    i++;
  } else
    if(display)
      fprintf(stderr, "cpp: input: [stdin]\n");

  if(i<argc) {
    /*
     * Get output file, "-" means use stdout.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "w", stdout) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open output file \"%s\"", argv[i]);
	return(-1);
      }
      if(display)
	fprintf(stderr, "cpp: output: %s\n", argv[i]);
    } else
      if(display)
	fprintf(stderr, "cpp: output: [stdout]\n");
  } else
    if(display)
      fprintf(stderr, "cpp: output: [stdout]\n");

  tagptr->tag=FPPTAG_OUTPUT;
  tagptr->data=(void *)own_output;
  tagptr++;

  tagptr->tag=FPPTAG_ERROR;
  tagptr->data=(void *)own_error;
  tagptr++;

  /* The LAST tag: */

  tagptr->tag=FPPTAG_END;
  tagptr->data=0;
  tagptr++;

#if defined(SHARED) && defined(AMIGA)
  if(!(FPPBase=OpenLibrary(FPPNAME, 1))) {
    printf("Error opening %s!\n", FPPNAME);
    return(-1);
  }
#endif
  fppPreProcess(tags);

#if defined(SHARED) && defined(AMIGA)
  CloseLibrary((struct Library *)FPPBase);
#endif
  /*
   * Preprocess ready!
   */

  if( dealloc )
    free( dealloc );

  return(0);
}